

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O0

void __thiscall tf::Executor::Executor(Executor *this,size_t N)

{
  undefined8 __n;
  bool bVar1;
  TFProfManager *this_00;
  undefined1 local_68 [24];
  string local_50;
  allocator<tf::Worker> local_19 [9];
  size_t N_local;
  Executor *this_local;
  
  local_19._1_8_ = N;
  N_local = (size_t)this;
  std::condition_variable::condition_variable(&this->_topology_cv);
  std::mutex::mutex(&this->_taskflow_mutex);
  std::mutex::mutex(&this->_topology_mutex);
  std::mutex::mutex(&this->_wsq_mutex);
  this->_num_topologies = 0;
  std::
  unordered_map<std::thread::id,_unsigned_long,_std::hash<std::thread::id>,_std::equal_to<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_unsigned_long>_>_>
  ::unordered_map(&this->_wids);
  __n = local_19._1_8_;
  std::allocator<tf::Worker>::allocator(local_19);
  std::vector<tf::Worker,_std::allocator<tf::Worker>_>::vector(&this->_workers,__n,local_19);
  std::allocator<tf::Worker>::~allocator(local_19);
  std::vector<std::thread,_std::allocator<std::thread>_>::vector(&this->_threads);
  std::__cxx11::list<tf::Taskflow,_std::allocator<tf::Taskflow>_>::list(&this->_taskflows);
  Notifier::Notifier(&this->_notifier,local_19._1_8_);
  TaskQueue<tf::Node_*>::TaskQueue(&this->_wsq,0x400);
  std::atomic<unsigned_long>::atomic(&this->_num_actives,0);
  std::atomic<unsigned_long>::atomic(&this->_num_thieves,0);
  std::atomic<bool>::atomic(&this->_done,false);
  std::
  unordered_set<std::shared_ptr<tf::ObserverInterface>,_std::hash<std::shared_ptr<tf::ObserverInterface>_>,_std::equal_to<std::shared_ptr<tf::ObserverInterface>_>,_std::allocator<std::shared_ptr<tf::ObserverInterface>_>_>
  ::unordered_set(&this->_observers);
  if ((__pthread_internal_list *)local_19._1_8_ == (__pthread_internal_list *)0x0) {
    throw_re<char_const(&)[36]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/ktnr[P]TwoStepBranchingProcedure/external/taskflow/taskflow/core/executor.hpp"
               ,0x2b2,(char (*) [36])"no cpu workers to execute taskflows");
  }
  _spawn(this,local_19._1_8_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"TF_ENABLE_PROFILER",(allocator<char> *)(local_68 + 0x17));
  bVar1 = has_env(&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)(local_68 + 0x17));
  if (bVar1) {
    this_00 = TFProfManager::get();
    make_observer<tf::TFProfObserver>((Executor *)local_68);
    TFProfManager::_manage(this_00,(shared_ptr<tf::TFProfObserver> *)local_68);
    std::shared_ptr<tf::TFProfObserver>::~shared_ptr((shared_ptr<tf::TFProfObserver> *)local_68);
  }
  return;
}

Assistant:

inline Executor::Executor(size_t N) :
  _workers    {N},
  _notifier   {N} {

  if(N == 0) {
    TF_THROW("no cpu workers to execute taskflows");
  }

  _spawn(N);

  // instantite the default observer if requested
  if(has_env(TF_ENABLE_PROFILER)) {
    TFProfManager::get()._manage(make_observer<TFProfObserver>());
  }
}